

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::transformVertexClipCoordsToWindowCoords
               (RenderState *state,VertexPacket *packet)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = (packet->position).m_data[3];
  fVar8 = (packet->position).m_data[0] / fVar1;
  fVar6 = (packet->position).m_data[1] / fVar1;
  fVar5 = (packet->position).m_data[2] / fVar1;
  (packet->position).m_data[0] = fVar8;
  (packet->position).m_data[1] = fVar6;
  (packet->position).m_data[2] = fVar5;
  (packet->position).m_data[3] = 1.0 / fVar1;
  fVar7 = (float)(state->viewport).rect.width * 0.5;
  iVar4 = (state->viewport).rect.bottom;
  fVar9 = (float)(state->viewport).rect.height * 0.5;
  fVar2 = (state->viewport).zn;
  fVar3 = (state->viewport).zf;
  (packet->position).m_data[0] = fVar7 * fVar8 + (float)(state->viewport).rect.left + fVar7;
  (packet->position).m_data[1] = fVar9 * fVar6 + (float)iVar4 + fVar9;
  (packet->position).m_data[2] = (fVar2 + fVar3) * 0.5 + (fVar3 - fVar2) * fVar5 * 0.5;
  (packet->position).m_data[3] = 1.0 / fVar1;
  return;
}

Assistant:

void transformVertexClipCoordsToWindowCoords (const RenderState& state, VertexPacket& packet)
{
	// To normalized device coords
	{
		packet.position = tcu::Vec4(packet.position.x()/packet.position.w(),
									packet.position.y()/packet.position.w(),
									packet.position.z()/packet.position.w(),
									1.0f               /packet.position.w());
	}

	// To window coords
	{
		const WindowRectangle&	viewport	= state.viewport.rect;
		const float				halfW		= (float)(viewport.width) / 2.0f;
		const float				halfH		= (float)(viewport.height) / 2.0f;
		const float				oX			= (float)viewport.left + halfW;
		const float				oY			= (float)viewport.bottom + halfH;
		const float				zn			= state.viewport.zn;
		const float				zf			= state.viewport.zf;

		packet.position = tcu::Vec4(packet.position.x()*halfW + oX,
									packet.position.y()*halfH + oY,
									packet.position.z()*(zf - zn)/2.0f + (zn + zf)/2.0f,
									packet.position.w());
	}
}